

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O0

void __thiscall ProKey::ProKey(ProKey *this,char *str)

{
  long lVar1;
  size_t sVar2;
  ProString *in_RSI;
  char **in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  uint in_stack_ffffffffffffffd0;
  storage_type *local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArrayView::QByteArrayView<const_char_*,_true>
            ((QByteArrayView *)(ulong)in_stack_ffffffffffffffd0,in_RDI);
  QVar3.m_data = local_20;
  QVar3.m_size = (qsizetype)in_RDI;
  QString::fromLatin1(QVar3);
  *(undefined4 *)(in_RDI + 3) = 0;
  sVar2 = qstrlen((char *)in_RSI);
  *(int *)((long)in_RDI + 0x1c) = (int)sVar2;
  *(undefined4 *)(in_RDI + 4) = 0;
  ProString::updatedHash(in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ProKey::ProKey(const char *str) :
    ProString(str, DoHash)
{
}